

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O1

REF_STATUS ref_inflate_compact_rail(REF_INT *n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi)

{
  uint uVar1;
  uint uVar2;
  REF_INT RVar3;
  ulong uVar4;
  REF_DBL *pRVar5;
  ulong uVar6;
  
  uVar1 = *n;
  if ((ulong)uVar1 != 0) {
    RVar3 = 1;
    if (1 < (int)uVar1) {
      pRVar5 = yz + 3;
      uVar4 = 0;
      uVar6 = 1;
      do {
        uVar2 = (uint)(1e-08 < x[uVar6] - x[uVar4]) + (int)uVar4;
        uVar4 = (ulong)uVar2;
        if (uVar6 != uVar4) {
          x[uVar4] = x[uVar6];
          yz[uVar2 * 2] = pRVar5[-1];
          yz[(ulong)(uVar2 * 2) + 1] = *pRVar5;
          phi[uVar4] = phi[uVar6];
        }
        uVar6 = uVar6 + 1;
        pRVar5 = pRVar5 + 2;
      } while (uVar1 != uVar6);
      RVar3 = uVar2 + 1;
    }
    *n = RVar3;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_compact_rail(REF_INT *n, REF_DBL *x, REF_DBL *yz,
                                            REF_DBL *phi) {
  REF_INT orig, compact, max;
  REF_DBL tol = 1e-8;
  if (0 == *n) return REF_SUCCESS;

  max = *n;
  compact = 0;

  for (orig = 1; orig < max; orig++) {
    if (ABS(x[orig] - x[compact] > tol)) {
      compact++;
    }
    if (orig != compact) {
      x[compact] = x[orig];
      yz[0 + 2 * compact] = yz[0 + 2 * orig];
      yz[1 + 2 * compact] = yz[1 + 2 * orig];
      phi[compact] = phi[orig];
    }
  }
  *n = compact + 1;

  return REF_SUCCESS;
}